

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int *piVar21;
  void *pvVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  float *pfVar30;
  ulong uVar31;
  float *pfVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  void *pvVar36;
  void *pvVar37;
  int iVar38;
  float *pfVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  float *pfVar46;
  uint uVar47;
  long lVar48;
  undefined4 *puVar49;
  int iVar50;
  undefined4 *puVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  float *pfVar57;
  bool bVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  uint extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar63 [16];
  undefined1 extraout_var [12];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar68;
  float fVar69;
  v4sf one;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined4 uVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  undefined8 uVar84;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  int inh;
  int elempack;
  ulong local_1e0;
  long local_1d0;
  void *local_1c8;
  undefined1 (*local_1b8) [16];
  long local_1b0;
  ulong local_1a0;
  ulong local_190;
  ulong local_110;
  Mat local_f8;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  ulong local_70;
  long local_68;
  long local_60;
  void *local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar35 = bottom_blob->elemsize;
  iVar6 = (this->super_Convolution1D).kernel_w;
  iVar7 = (this->super_Convolution1D).dilation_w;
  iVar8 = bottom_blob->elempack;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_f8,opt);
  iVar41 = -100;
  local_98 = CONCAT44(local_98._4_4_,(float)local_98);
  if ((local_f8.data != (void *)0x0) &&
     (local_98 = CONCAT44(local_98._4_4_,(float)local_98), (long)local_f8.c * local_f8.cstep != 0))
  {
    uVar24 = (this->super_Convolution1D).num_output;
    bVar23 = (uVar24 & 3) == 0 & opt->use_packing_layout;
    iVar50 = (uint)bVar23 + (uint)bVar23 * 2 + 1;
    Mat::create(top_blob,(~((iVar6 + -1) * iVar7) + local_f8.w) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar24 / iVar50,
                uVar35 / (ulong)(long)iVar8 << bVar23 * '\x02',iVar50,opt->blob_allocator);
    iVar6 = local_f8.elempack;
    auVar88 = _DAT_005a5aa0;
    auVar87 = _DAT_005a5a90;
    local_98 = CONCAT44(local_98._4_4_,(float)local_98);
    if ((top_blob->data != (void *)0x0) &&
       (local_98 = CONCAT44(local_98._4_4_,(float)local_98),
       (long)top_blob->c * top_blob->cstep != 0)) {
      iVar7 = (this->super_Convolution1D).kernel_w;
      iVar8 = (this->super_Convolution1D).activation_type;
      iVar41 = (this->super_Convolution1D).dilation_w;
      lVar52 = (long)iVar41;
      iVar50 = (this->super_Convolution1D).stride_w;
      lVar34 = (long)iVar50;
      pvVar11 = (this->super_Convolution1D).bias_data.data;
      uVar24 = local_f8.h * local_f8.elempack;
      iVar25 = local_f8.w * local_f8.elempack;
      uVar35 = (long)top_blob->h * (long)top_blob->elempack;
      iVar10 = (int)uVar35;
      iVar26 = iVar10 + 3;
      if (-1 < iVar10) {
        iVar26 = iVar10;
      }
      uVar9 = top_blob->w;
      uVar43 = iVar26 >> 2;
      lVar40 = (long)iVar25;
      if (3 < iVar10) {
        lVar48 = (long)top_blob->elempack * (long)(int)uVar9;
        iVar26 = (int)lVar48;
        lVar27 = (long)(iVar26 * 3);
        local_88._0_8_ = lVar27;
        local_1e0 = 0;
        fVar98 = (float)DAT_005a5a90;
        fVar99 = DAT_005a5a90._4_4_;
        fVar100 = DAT_005a5a90._8_4_;
        fVar101 = DAT_005a5a90._12_4_;
        fVar65 = (float)DAT_005a5aa0;
        fVar68 = DAT_005a5aa0._4_4_;
        fVar69 = DAT_005a5aa0._8_4_;
        do {
          lVar28 = (long)top_blob->w;
          if (0 < lVar28) {
            uVar47 = local_f8.h * local_f8.elempack;
            iVar33 = top_blob->elempack;
            local_1b8 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)(local_1e0 * 4) >> 0x1f) << 0x20 |
                                     local_1e0 * 4 & 0xffffffff) / (long)iVar33) * lVar28 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1b0 = 0;
            iVar44 = 0;
            lVar56 = 0;
            local_190 = lVar40 * 4;
            do {
              fVar106 = 0.0;
              fVar107 = 0.0;
              fVar108 = 0.0;
              fVar109 = 0.0;
              fVar92 = 0.0;
              fVar95 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              if (pvVar11 != (void *)0x0) {
                pfVar57 = (float *)((long)pvVar11 + local_1e0 * 0x10);
                fVar92 = *pfVar57;
                fVar95 = pfVar57[1];
                fVar96 = pfVar57[2];
                fVar97 = pfVar57[3];
              }
              pfVar57 = (float *)((this->weight_data_tm).cstep * local_1e0 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              uVar31 = 0;
              if ((int)uVar47 < 4) {
                fVar83 = 0.0;
                fVar89 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                fVar102 = 0.0;
                fVar103 = 0.0;
                fVar104 = 0.0;
                fVar105 = 0.0;
              }
              else {
                fVar102 = 0.0;
                fVar103 = 0.0;
                fVar104 = 0.0;
                fVar105 = 0.0;
                fVar83 = 0.0;
                fVar89 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                iVar42 = 0;
                do {
                  lVar29 = (long)(iVar42 / local_f8.elempack) *
                           (long)local_f8.w *
                           CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                  if (local_f8.elempack == 4) {
                    if (0 < iVar7) {
                      pfVar30 = (float *)((long)local_f8.data + lVar29 + (long)iVar44 * 4);
                      iVar38 = iVar7;
                      do {
                        fVar1 = *pfVar30;
                        fVar2 = pfVar30[1];
                        fVar3 = pfVar30[2];
                        fVar4 = pfVar30[3];
                        fVar92 = fVar92 + fVar1 * *pfVar57;
                        fVar95 = fVar95 + fVar1 * pfVar57[1];
                        fVar96 = fVar96 + fVar1 * pfVar57[2];
                        fVar97 = fVar97 + fVar1 * pfVar57[3];
                        fVar102 = fVar102 + fVar2 * pfVar57[4];
                        fVar103 = fVar103 + fVar2 * pfVar57[5];
                        fVar104 = fVar104 + fVar2 * pfVar57[6];
                        fVar105 = fVar105 + fVar2 * pfVar57[7];
                        fVar83 = fVar83 + fVar3 * pfVar57[8];
                        fVar89 = fVar89 + fVar3 * pfVar57[9];
                        fVar90 = fVar90 + fVar3 * pfVar57[10];
                        fVar91 = fVar91 + fVar3 * pfVar57[0xb];
                        fVar106 = fVar106 + fVar4 * pfVar57[0xc];
                        fVar107 = fVar107 + fVar4 * pfVar57[0xd];
                        fVar108 = fVar108 + fVar4 * pfVar57[0xe];
                        fVar109 = fVar109 + fVar4 * pfVar57[0xf];
                        pfVar57 = pfVar57 + 0x10;
                        pfVar30 = pfVar30 + iVar41 * 4;
                        iVar38 = iVar38 + -1;
                      } while (iVar38 != 0);
                      goto LAB_0052b421;
                    }
                  }
                  else {
                    pfVar30 = (float *)((long)local_f8.data +
                                       lVar29 + (long)(iVar50 * local_f8.elempack * (int)lVar56) * 4
                                       );
LAB_0052b421:
                    if ((local_f8.elempack == 1) && (iVar38 = iVar7, 0 < iVar7)) {
                      do {
                        fVar1 = *pfVar30;
                        fVar92 = fVar92 + fVar1 * *pfVar57;
                        fVar95 = fVar95 + fVar1 * pfVar57[1];
                        fVar96 = fVar96 + fVar1 * pfVar57[2];
                        fVar97 = fVar97 + fVar1 * pfVar57[3];
                        fVar1 = pfVar30[lVar40];
                        fVar102 = fVar102 + fVar1 * pfVar57[4];
                        fVar103 = fVar103 + fVar1 * pfVar57[5];
                        fVar104 = fVar104 + fVar1 * pfVar57[6];
                        fVar105 = fVar105 + fVar1 * pfVar57[7];
                        fVar1 = pfVar30[iVar25 * 2];
                        fVar83 = fVar83 + fVar1 * pfVar57[8];
                        fVar89 = fVar89 + fVar1 * pfVar57[9];
                        fVar90 = fVar90 + fVar1 * pfVar57[10];
                        fVar91 = fVar91 + fVar1 * pfVar57[0xb];
                        fVar1 = pfVar30[iVar25 * 3];
                        fVar106 = fVar106 + fVar1 * pfVar57[0xc];
                        fVar107 = fVar107 + fVar1 * pfVar57[0xd];
                        fVar108 = fVar108 + fVar1 * pfVar57[0xe];
                        fVar109 = fVar109 + fVar1 * pfVar57[0xf];
                        pfVar57 = pfVar57 + 0x10;
                        pfVar30 = pfVar30 + lVar52;
                        iVar38 = iVar38 + -1;
                      } while (iVar38 != 0);
                    }
                  }
                  iVar38 = iVar42 + 7;
                  iVar42 = iVar42 + 4;
                } while (iVar38 < (int)uVar47);
                uVar31 = (ulong)uVar47 & 0xfffffffc;
              }
              uVar45 = (uint)uVar31;
              if ((int)(uVar45 | 1) < (int)uVar47) {
                lVar29 = (long)local_f8.w *
                         CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                lVar53 = lVar29 * uVar31;
                lVar55 = (long)local_f8.data + lVar53 + local_190;
                lVar29 = lVar29 * 2;
                lVar53 = (long)local_f8.data + lVar53 + local_1b0;
                do {
                  if (0 < iVar7) {
                    lVar54 = 0;
                    iVar42 = iVar7;
                    do {
                      fVar1 = *(float *)(lVar53 + lVar54);
                      fVar92 = fVar92 + fVar1 * *pfVar57;
                      fVar95 = fVar95 + fVar1 * pfVar57[1];
                      fVar96 = fVar96 + fVar1 * pfVar57[2];
                      fVar97 = fVar97 + fVar1 * pfVar57[3];
                      fVar1 = *(float *)(lVar55 + lVar54);
                      fVar102 = fVar102 + fVar1 * pfVar57[4];
                      fVar103 = fVar103 + fVar1 * pfVar57[5];
                      fVar104 = fVar104 + fVar1 * pfVar57[6];
                      fVar105 = fVar105 + fVar1 * pfVar57[7];
                      pfVar57 = pfVar57 + 8;
                      lVar54 = lVar54 + lVar52 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar45 = (uint)uVar31;
                  lVar55 = lVar55 + lVar29;
                  lVar53 = lVar53 + lVar29;
                } while ((int)(uVar45 | 1) < (int)uVar47);
              }
              if ((int)uVar45 < (int)uVar47) {
                lVar29 = (long)local_f8.w *
                         CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                uVar31 = (ulong)uVar45;
                pfVar30 = (float *)(lVar29 * uVar31 + local_1b0 + (long)local_f8.data);
                do {
                  pfVar46 = pfVar30;
                  iVar42 = iVar7;
                  if (0 < iVar7) {
                    do {
                      fVar1 = *pfVar46;
                      fVar92 = fVar92 + fVar1 * *pfVar57;
                      fVar95 = fVar95 + fVar1 * pfVar57[1];
                      fVar96 = fVar96 + fVar1 * pfVar57[2];
                      fVar97 = fVar97 + fVar1 * pfVar57[3];
                      pfVar57 = pfVar57 + 4;
                      pfVar46 = pfVar46 + lVar52;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar30 = (float *)((long)pfVar30 + lVar29);
                } while ((int)uVar31 < (int)uVar47);
              }
              fVar106 = fVar83 + fVar106 + fVar102 + fVar92;
              fVar95 = fVar89 + fVar107 + fVar103 + fVar95;
              auVar86._0_8_ = CONCAT44(fVar95,fVar106);
              auVar86._8_4_ = fVar90 + fVar108 + fVar104 + fVar96;
              auVar86._12_4_ = fVar91 + fVar109 + fVar105 + fVar97;
              fVar92 = auVar88._12_4_;
              switch(iVar8) {
              case 1:
                auVar86 = maxps(auVar86,ZEXT816(0));
                break;
              case 2:
                auVar73._8_4_ = auVar86._8_4_;
                auVar73._0_8_ = auVar86._0_8_;
                auVar73._12_4_ = auVar86._12_4_;
                auVar74 = maxps(auVar73,ZEXT816(0));
                auVar75 = minps(auVar86,ZEXT816(0));
                fVar92 = *(this->super_Convolution1D).activation_params.data;
                auVar86._4_4_ = fVar92 * auVar75._4_4_ + auVar74._4_4_;
                auVar86._0_4_ = fVar92 * auVar75._0_4_ + auVar74._0_4_;
                auVar86._8_4_ = fVar92 * auVar75._8_4_ + auVar74._8_4_;
                auVar86._12_4_ = fVar92 * auVar75._12_4_ + auVar74._12_4_;
                break;
              case 3:
                puVar51 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar82 = *puVar51;
                uVar5 = puVar51[1];
                auVar72._4_4_ = uVar82;
                auVar72._0_4_ = uVar82;
                auVar72._8_4_ = uVar82;
                auVar72._12_4_ = uVar82;
                auVar86 = maxps(auVar86,auVar72);
                auVar18._4_4_ = uVar5;
                auVar18._0_4_ = uVar5;
                auVar18._8_4_ = uVar5;
                auVar18._12_4_ = uVar5;
                auVar86 = minps(auVar86,auVar18);
                break;
              case 4:
                auVar85._0_8_ = CONCAT44(fVar95,fVar106) ^ 0x8000000080000000;
                auVar85._8_4_ = -auVar86._8_4_;
                auVar85._12_4_ = -auVar86._12_4_;
                auVar86 = minps(auVar85,_DAT_005a5a60);
                auVar86 = maxps(auVar86,_DAT_005a5a70);
                fVar96 = auVar86._0_4_ * 1.442695 + fVar98;
                fVar106 = auVar86._4_4_ * 1.442695 + fVar99;
                fVar108 = auVar86._8_4_ * 1.442695 + fVar100;
                fVar83 = auVar86._12_4_ * 1.442695 + fVar101;
                fVar95 = (float)(int)fVar96;
                fVar97 = (float)(int)fVar106;
                fVar107 = (float)(int)fVar108;
                fVar109 = (float)(int)fVar83;
                fVar95 = fVar95 - (float)(-(uint)(fVar96 < fVar95) & (uint)fVar65);
                fVar97 = fVar97 - (float)(-(uint)(fVar106 < fVar97) & (uint)fVar68);
                fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)fVar69);
                fVar109 = fVar109 - (float)(-(uint)(fVar83 < fVar109) & (uint)fVar92);
                fVar96 = fVar95 * -0.6931472 + auVar86._0_4_;
                fVar106 = fVar97 * -0.6931472 + auVar86._4_4_;
                fVar108 = fVar107 * -0.6931472 + auVar86._8_4_;
                fVar83 = fVar109 * -0.6931472 + auVar86._12_4_;
                auVar17._4_4_ =
                     (float)((int)fVar97 * 0x800000 + (int)fVar68) *
                     (fVar106 + fVar68 +
                     (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106
                       + 0.041665796) * fVar106 + 0.16666666) * fVar106 + fVar99) *
                     fVar106 * fVar106) + fVar68;
                auVar17._0_4_ =
                     (float)((int)fVar95 * 0x800000 + (int)fVar65) *
                     (fVar96 + fVar65 +
                     (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
                       0.041665796) * fVar96 + 0.16666666) * fVar96 + fVar98) * fVar96 * fVar96) +
                     fVar65;
                auVar17._8_4_ =
                     (float)((int)fVar107 * 0x800000 + (int)fVar69) *
                     (fVar108 + fVar69 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + fVar100) *
                     fVar108 * fVar108) + fVar69;
                auVar17._12_4_ =
                     (float)((int)fVar109 * 0x800000 + (int)fVar92) *
                     (fVar83 + fVar92 +
                     (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                       0.041665796) * fVar83 + 0.16666666) * fVar83 + fVar101) * fVar83 * fVar83) +
                     fVar92;
                auVar86 = divps(auVar88,auVar17);
                break;
              case 5:
                auVar70._8_4_ = auVar86._8_4_;
                auVar70._0_8_ = auVar86._0_8_;
                auVar70._12_4_ = auVar86._12_4_;
                auVar74 = minps(auVar70,_DAT_005a5a60);
                auVar74 = maxps(auVar74,_DAT_005a5a70);
                fVar96 = auVar74._0_4_ * 1.442695 + fVar98;
                fVar97 = auVar74._4_4_ * 1.442695 + fVar99;
                fVar107 = auVar74._8_4_ * 1.442695 + fVar100;
                fVar108 = auVar74._12_4_ * 1.442695 + fVar101;
                fVar109 = (float)(int)fVar96;
                fVar83 = (float)(int)fVar97;
                fVar89 = (float)(int)fVar107;
                fVar90 = (float)(int)fVar108;
                fVar109 = fVar109 - (float)(-(uint)(fVar96 < fVar109) & (uint)fVar65);
                fVar83 = fVar83 - (float)(-(uint)(fVar97 < fVar83) & (uint)fVar68);
                fVar89 = fVar89 - (float)(-(uint)(fVar107 < fVar89) & (uint)fVar69);
                fVar90 = fVar90 - (float)(-(uint)(fVar108 < fVar90) & (uint)fVar92);
                fVar96 = auVar74._0_4_ - fVar109 * 0.6931472;
                fVar97 = auVar74._4_4_ - fVar83 * 0.6931472;
                fVar107 = auVar74._8_4_ - fVar89 * 0.6931472;
                fVar108 = auVar74._12_4_ - fVar90 * 0.6931472;
                auVar93._0_4_ =
                     (float)((int)fVar109 * 0x800000 + (int)fVar65) *
                     (fVar96 + fVar65 +
                     (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
                       0.041665796) * fVar96 + 0.16666666) * fVar96 + fVar98) * fVar96 * fVar96) +
                     fVar65;
                auVar93._4_4_ =
                     (float)((int)fVar83 * 0x800000 + (int)fVar68) *
                     (fVar97 + fVar68 +
                     (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                       0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar99) * fVar97 * fVar97) +
                     fVar68;
                auVar93._8_4_ =
                     (float)((int)fVar89 * 0x800000 + (int)fVar69) *
                     (fVar107 + fVar69 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + fVar100) *
                     fVar107 * fVar107) + fVar69;
                auVar93._12_4_ =
                     (float)((int)fVar90 * 0x800000 + (int)fVar92) *
                     (fVar108 + fVar92 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + fVar101) *
                     fVar108 * fVar108) + fVar92;
                auVar74 = maxps(auVar93,_DAT_005a5b10);
                auVar94._0_8_ = auVar74._0_8_ & 0x807fffff807fffff;
                auVar94._8_4_ = auVar74._8_4_ & 0x807fffff;
                auVar94._12_4_ = auVar74._12_4_ & 0x807fffff;
                auVar94 = auVar94 | auVar87;
                fVar96 = auVar94._0_4_;
                fVar107 = auVar94._4_4_;
                fVar109 = auVar94._8_4_;
                fVar89 = auVar94._12_4_;
                fVar97 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                fVar83 = fVar109 + -1.0 + (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar109);
                fVar90 = fVar89 + -1.0 + (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar89);
                auVar71._0_8_ =
                     CONCAT44(-(uint)(auVar93._4_4_ <= 0.0),-(uint)(auVar93._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar71._8_4_ = -(uint)(auVar93._8_4_ <= 0.0) & 0x7fffffff;
                auVar71._12_4_ = -(uint)(auVar93._12_4_ <= 0.0) & 0x7fffffff;
                auVar15._4_4_ =
                     ~-(uint)(auVar93._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar68)) * 0.6931472 +
                             fVar108 +
                            (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) *
                                   fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                              fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                auVar15._0_4_ =
                     ~-(uint)(auVar93._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar65)) * 0.6931472 +
                             fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                             0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                           0.14249323) * fVar97 + -0.16668057) * fVar97 + 0.20000714
                                         ) * fVar97 + -0.24999994) * fVar97 + 0.3333333) * fVar97 +
                                      -0.5) * fVar97 * fVar97) * -2.0);
                auVar15._8_4_ =
                     ~-(uint)(auVar93._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                             fVar83 + (((((((((fVar83 * 0.070376836 + -0.1151461) * fVar83 +
                                             0.116769984) * fVar83 + -0.12420141) * fVar83 +
                                           0.14249323) * fVar83 + -0.16668057) * fVar83 + 0.20000714
                                         ) * fVar83 + -0.24999994) * fVar83 + 0.3333333) * fVar83 +
                                      -0.5) * fVar83 * fVar83) * -2.0);
                auVar15._12_4_ =
                     ~-(uint)(auVar93._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar89 < 0.70710677) & (uint)fVar92)) * 0.6931472 +
                             fVar90 + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 +
                                             0.116769984) * fVar90 + -0.12420141) * fVar90 +
                                           0.14249323) * fVar90 + -0.16668057) * fVar90 + 0.20000714
                                         ) * fVar90 + -0.24999994) * fVar90 + 0.3333333) * fVar90 +
                                      -0.5) * fVar90 * fVar90) * -2.0);
                auVar74 = minps(auVar71 | auVar15,_DAT_005a5a60);
                auVar74 = maxps(auVar74,_DAT_005a5a70);
                fVar96 = auVar74._0_4_ * 1.442695 + fVar98;
                fVar97 = auVar74._4_4_ * 1.442695 + fVar99;
                fVar107 = auVar74._8_4_ * 1.442695 + fVar100;
                fVar108 = auVar74._12_4_ * 1.442695 + fVar101;
                fVar109 = (float)(int)fVar96;
                fVar83 = (float)(int)fVar97;
                fVar89 = (float)(int)fVar107;
                fVar90 = (float)(int)fVar108;
                fVar109 = fVar109 - (float)(-(uint)(fVar96 < fVar109) & (uint)fVar65);
                fVar83 = fVar83 - (float)(-(uint)(fVar97 < fVar83) & (uint)fVar68);
                fVar89 = fVar89 - (float)(-(uint)(fVar107 < fVar89) & (uint)fVar69);
                fVar90 = fVar90 - (float)(-(uint)(fVar108 < fVar90) & (uint)fVar92);
                fVar96 = auVar74._0_4_ - fVar109 * 0.6931472;
                fVar97 = auVar74._4_4_ - fVar83 * 0.6931472;
                fVar107 = auVar74._8_4_ - fVar89 * 0.6931472;
                fVar108 = auVar74._12_4_ - fVar90 * 0.6931472;
                auVar16._4_4_ =
                     (float)((int)fVar83 * 0x800000 + (int)fVar68) *
                     (fVar97 + fVar68 +
                     (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                       0.041665796) * fVar97 + 0.16666666) * fVar97 + fVar99) * fVar97 * fVar97) +
                     fVar68;
                auVar16._0_4_ =
                     (float)((int)fVar109 * 0x800000 + (int)fVar65) *
                     (fVar96 + fVar65 +
                     (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
                       0.041665796) * fVar96 + 0.16666666) * fVar96 + fVar98) * fVar96 * fVar96) +
                     fVar65;
                auVar16._8_4_ =
                     (float)((int)fVar89 * 0x800000 + (int)fVar69) *
                     (fVar107 + fVar69 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + fVar100) *
                     fVar107 * fVar107) + fVar69;
                auVar16._12_4_ =
                     (float)((int)fVar90 * 0x800000 + (int)fVar92) *
                     (fVar108 + fVar92 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + fVar101) *
                     fVar108 * fVar108) + fVar92;
                auVar74 = divps(_DAT_005a6720,auVar16);
                auVar75._0_4_ = auVar74._0_4_ + -1.0;
                auVar75._4_4_ = auVar74._4_4_ + -1.0;
                auVar75._8_4_ = auVar74._8_4_ + -1.0;
                auVar75._12_4_ = auVar74._12_4_ + -1.0;
                goto LAB_0052b944;
              case 6:
                pfVar57 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar92 = *pfVar57;
                fVar96 = pfVar57[1];
                auVar74._0_4_ = fVar92 * fVar106 + fVar96;
                auVar74._4_4_ = fVar92 * fVar95 + fVar96;
                auVar74._8_4_ = fVar92 * auVar86._8_4_ + fVar96;
                auVar74._12_4_ = fVar92 * auVar86._12_4_ + fVar96;
                auVar74 = maxps(auVar74,ZEXT816(0));
                auVar75 = minps(auVar74,auVar88);
LAB_0052b944:
                auVar86._0_4_ = fVar106 * auVar75._0_4_;
                auVar86._4_4_ = fVar95 * auVar75._4_4_;
                auVar86._8_4_ = auVar86._8_4_ * auVar75._8_4_;
                auVar86._12_4_ = auVar86._12_4_ * auVar75._12_4_;
              }
              if (iVar33 == 1) {
                *(int *)*local_1b8 = auVar86._0_4_;
                *(int *)((long)*local_1b8 + lVar48 * 4) = auVar86._4_4_;
                *(int *)((long)*local_1b8 + (long)(iVar26 * 2) * 4) = auVar86._8_4_;
                *(int *)((long)*local_1b8 + lVar27 * 4) = auVar86._12_4_;
                local_1b8 = (undefined1 (*) [16])((long)*local_1b8 + 4);
              }
              else if (iVar33 == 4) {
                *local_1b8 = auVar86;
                local_1b8 = local_1b8 + 1;
              }
              lVar56 = lVar56 + 1;
              iVar44 = iVar44 + iVar50 * local_f8.elempack;
              local_190 = local_190 + lVar34 * 4;
              local_1b0 = local_1b0 + lVar34 * 4;
            } while (lVar56 != lVar28);
          }
          local_1e0 = local_1e0 + 1;
        } while (local_1e0 != uVar43);
      }
      iVar26 = iVar10 + uVar43 * -4;
      local_70 = (ulong)(uint)(iVar26 / 2);
      if (1 < iVar26) {
        uVar45 = local_f8.h * local_f8.elempack;
        uVar47 = top_blob->w;
        local_40 = top_blob->data;
        local_48 = (long)(int)uVar47 * top_blob->elemsize;
        iVar26 = iVar50 * local_f8.elempack;
        local_50 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        local_58 = (this->weight_data_tm).data;
        bVar58 = local_f8.elempack == 1;
        local_60 = (long)(int)(uVar43 * 4);
        local_68 = lVar40 * 4;
        local_110 = 0;
        local_38 = local_70;
        do {
          if (0 < (int)uVar47) {
            lVar27 = local_60 + local_110 * 2;
            puVar49 = (undefined4 *)((local_60 + local_110 * 2 + 1) * local_48 + (long)local_40);
            puVar51 = (undefined4 *)(lVar27 * local_48 + (long)local_40);
            uVar59 = (uint)lVar27;
            uVar60 = uVar59 + 3;
            if (-1 < (int)uVar59) {
              uVar60 = uVar59;
            }
            pfVar30 = (float *)((((int)(uVar59 - (uVar60 & 0xfffffffc)) >> 1) + ((int)uVar60 >> 2))
                                * local_50 + (long)local_58);
            lVar48 = (long)local_f8.w *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
            pfVar57 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1a0 = local_68 + (long)local_f8.data;
            iVar33 = 0;
            local_88._0_8_ = local_f8.data;
            local_1c8 = local_f8.data;
            local_1e0 = 0;
            do {
              fVar65 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              fVar98 = 0.0;
              uVar84 = 0;
              if (pvVar11 != (void *)0x0) {
                uVar84 = *(undefined8 *)((long)pvVar11 + lVar27 * 4);
              }
              uVar31 = 0;
              fVar99 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar92 = 0.0;
              pfVar46 = pfVar30;
              if (3 < (int)uVar45) {
                iVar44 = 0;
                do {
                  lVar28 = (iVar44 / iVar6) * lVar48;
                  if (iVar6 == 4) {
                    if (0 < iVar7) {
                      pfVar32 = (float *)(lVar28 + (long)iVar33 * 4 + local_88._0_8_);
                      iVar42 = iVar7;
                      do {
                        fVar65 = fVar65 + *pfVar46 * *pfVar32;
                        fVar68 = fVar68 + pfVar46[1] * pfVar32[1];
                        fVar69 = fVar69 + pfVar46[2] * pfVar32[2];
                        fVar98 = fVar98 + pfVar46[3] * pfVar32[3];
                        fVar99 = fVar99 + *pfVar32 * pfVar46[4];
                        fVar100 = fVar100 + pfVar32[1] * pfVar46[5];
                        fVar101 = fVar101 + pfVar32[2] * pfVar46[6];
                        fVar92 = fVar92 + pfVar32[3] * pfVar46[7];
                        pfVar46 = pfVar46 + 8;
                        pfVar32 = pfVar32 + iVar41 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_0052bcf1;
                    }
                  }
                  else {
                    pfVar32 = (float *)(lVar28 + local_88._0_8_ +
                                                 (long)(iVar26 * (int)local_1e0) * 4);
LAB_0052bcf1:
                    iVar42 = iVar7;
                    if (0 < iVar7 && bVar58) {
                      do {
                        fVar65 = fVar65 + *pfVar46 * *pfVar32;
                        fVar68 = fVar68 + pfVar46[1] * pfVar32[lVar40];
                        fVar69 = fVar69 + pfVar46[2] * pfVar32[iVar25 * 2];
                        fVar98 = fVar98 + pfVar46[3] * pfVar32[iVar25 * 3];
                        fVar99 = fVar99 + *pfVar32 * pfVar46[4];
                        fVar100 = fVar100 + pfVar32[lVar40] * pfVar46[5];
                        fVar101 = fVar101 + pfVar32[iVar25 * 2] * pfVar46[6];
                        fVar92 = fVar92 + pfVar32[iVar25 * 3] * pfVar46[7];
                        pfVar46 = pfVar46 + 8;
                        pfVar32 = pfVar32 + lVar52;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  iVar42 = iVar44 + 7;
                  iVar44 = iVar44 + 4;
                } while (iVar42 < (int)uVar45);
                uVar31 = (ulong)uVar45 & 0xfffffffc;
              }
              auVar87._0_4_ = (float)uVar84 + fVar69 + fVar65 + fVar98 + fVar68;
              auVar87._4_4_ = (float)((ulong)uVar84 >> 0x20) + fVar101 + fVar99 + fVar92 + fVar100;
              auVar87._8_4_ = fVar98 + fVar68 + 0.0 + fVar69 + fVar69;
              auVar87._12_4_ = fVar92 + fVar100 + 0.0 + fVar98 + fVar98;
              uVar59 = (uint)uVar31;
              if ((int)(uVar59 | 1) < (int)uVar45) {
                lVar28 = local_1a0 + lVar48 * uVar31;
                pvVar36 = (void *)(lVar48 * uVar31 + (long)local_1c8);
                do {
                  if (0 < iVar7) {
                    lVar56 = 0;
                    iVar44 = iVar7;
                    do {
                      fVar65 = *(float *)((long)pvVar36 + lVar56);
                      fVar69 = auVar87._4_4_;
                      fVar98 = auVar87._8_4_;
                      fVar99 = auVar87._12_4_;
                      fVar68 = *(float *)(lVar28 + lVar56);
                      auVar87._0_4_ =
                           fVar68 * (float)*(undefined8 *)(pfVar46 + 2) +
                           (float)*(undefined8 *)pfVar46 * fVar65 + auVar87._0_4_;
                      auVar87._4_4_ =
                           fVar68 * (float)((ulong)*(undefined8 *)(pfVar46 + 2) >> 0x20) +
                           (float)((ulong)*(undefined8 *)pfVar46 >> 0x20) * fVar65 + fVar69;
                      auVar87._8_4_ = fVar68 * 0.0 + fVar65 * 0.0 + fVar98;
                      auVar87._12_4_ = fVar68 * 0.0 + fVar65 * 0.0 + fVar99;
                      pfVar46 = pfVar46 + 4;
                      lVar56 = lVar56 + lVar52 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar59 = (uint)uVar31;
                  lVar28 = lVar28 + lVar48 * 2;
                  pvVar36 = (void *)((long)pvVar36 + lVar48 * 2);
                } while ((int)(uVar59 | 1) < (int)uVar45);
              }
              if ((int)uVar59 < (int)uVar45) {
                uVar31 = (ulong)uVar59;
                pfVar32 = (float *)(lVar48 * uVar31 + (long)local_1c8);
                do {
                  pfVar39 = pfVar32;
                  auVar88 = auVar87;
                  iVar44 = iVar7;
                  if (0 < iVar7) {
                    do {
                      fVar65 = *pfVar39;
                      auVar87._0_4_ = auVar88._0_4_ + fVar65 * (float)*(undefined8 *)pfVar46;
                      auVar87._4_4_ =
                           auVar88._4_4_ + fVar65 * (float)((ulong)*(undefined8 *)pfVar46 >> 0x20);
                      auVar87._8_4_ = auVar88._8_4_ + fVar65 * 0.0;
                      auVar87._12_4_ = auVar88._12_4_ + fVar65 * 0.0;
                      pfVar46 = pfVar46 + 2;
                      pfVar39 = pfVar39 + lVar52;
                      iVar44 = iVar44 + -1;
                      auVar88 = auVar87;
                    } while (iVar44 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar48);
                } while ((int)uVar31 < (int)uVar45);
              }
              uVar31 = auVar87._0_8_;
              fVar65 = auVar87._0_4_;
              fVar68 = auVar87._4_4_;
              fVar69 = auVar87._8_4_;
              fVar98 = auVar87._12_4_;
              auVar88._4_12_ = auVar87._4_12_;
              switch(iVar8) {
              case 1:
                auVar87 = maxps(auVar87,_DAT_005a4060);
                uVar31 = auVar87._0_8_;
                break;
              case 2:
                fVar99 = *pfVar57;
                auVar76._0_4_ = ~-(uint)(0.0 < fVar65) & (uint)fVar99;
                auVar76._4_4_ = ~-(uint)(0.0 < fVar68) & (uint)fVar99;
                auVar76._8_4_ = ~-(uint)(0.0 < fVar69) & (uint)fVar99;
                auVar76._12_4_ = ~-(uint)(0.0 < fVar98) & (uint)fVar99;
                auVar63._0_8_ =
                     CONCAT44(-(uint)(0.0 < fVar68),-(uint)(0.0 < fVar65)) & 0x3f8000003f800000;
                auVar63._8_8_ = 0;
                uVar31 = CONCAT44(fVar68 * SUB164(auVar63 | auVar76,4),
                                  fVar65 * SUB164(auVar63 | auVar76,0));
                break;
              case 3:
                uVar31 = *(ulong *)pfVar57;
                fVar99 = (float)uVar31;
                fVar100 = (float)(uVar31 >> 0x20);
                if (fVar99 <= fVar65) {
                  uVar31 = (ulong)(uint)fVar65;
                }
                uVar59 = -(uint)(fVar100 < (float)uVar31);
                auVar79._0_4_ = ~-(uint)(fVar68 < fVar99) & (uint)fVar68;
                auVar79._4_4_ = ~uVar59 & (uint)(float)uVar31;
                auVar79._8_4_ = ~-(uint)(fVar69 < 0.0) & (uint)fVar69;
                auVar79._12_4_ = ~-(uint)(fVar98 < 0.0) & (uint)fVar98;
                auVar19._4_4_ = (uint)fVar100 & uVar59;
                auVar19._0_4_ = (uint)fVar99 & -(uint)(fVar68 < fVar99);
                auVar19._8_8_ = 0;
                fVar65 = SUB164(auVar79 | auVar19,0);
                uVar82 = SUB164(auVar79 | auVar19,4);
                uVar31 = CONCAT44(fVar65,uVar82);
                if (fVar100 < fVar65) {
                  uVar31 = CONCAT44(fVar100,uVar82);
                }
                break;
              case 4:
                auVar87 = minps(auVar87,_DAT_005a6740);
                uVar59 = -(uint)(auVar87._0_4_ < -88.37626);
                uVar60 = -(uint)(auVar87._4_4_ < -88.37626);
                uVar61 = -(uint)(auVar87._8_4_ < 0.0);
                uVar62 = -(uint)(auVar87._12_4_ < 0.0);
                local_98._0_4_ =
                     (float)(~uVar59 & (uint)-auVar87._0_4_ | (uint)DAT_005a6740 & uVar59);
                local_98._4_4_ =
                     (float)(~uVar60 & (uint)-auVar87._4_4_ | DAT_005a6740._4_4_ & uVar60);
                uStack_90 = ~uVar61 & (uint)-auVar87._8_4_ | DAT_005a6740._8_4_ & uVar61;
                uStack_8c = ~uVar62 & (uint)-auVar87._12_4_ | DAT_005a6740._12_4_ & uVar62;
                local_a8._0_4_ = expf((float)local_98);
                local_a8._4_4_ = extraout_XMM0_Db_00;
                uStack_a0 = extraout_XMM0_Dc_00;
                uStack_9c = extraout_XMM0_Dd_00;
                fVar65 = expf(local_98._4_4_);
                auVar66._0_4_ = (float)local_a8._0_4_ + (float)DAT_005a4020;
                auVar66._4_4_ = fVar65 + DAT_005a4020._4_4_;
                auVar66._8_4_ = (float)local_a8._4_4_ + DAT_005a4020._8_4_;
                auVar66._12_4_ = extraout_XMM0_Db_01 + DAT_005a4020._12_4_;
                auVar87 = divps(_DAT_005a4020,auVar66);
                uVar31 = auVar87._0_8_;
                break;
              case 5:
                _local_a8 = auVar87;
                fVar65 = expf(fVar65);
                fVar65 = logf(fVar65 + 1.0);
                local_98._0_4_ = tanhf(fVar65);
                local_98._4_4_ = extraout_XMM0_Db;
                uStack_90 = extraout_XMM0_Dc;
                uStack_8c = extraout_XMM0_Dd;
                fVar65 = expf((float)local_a8._4_4_);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
                uVar31 = CONCAT44((float)local_a8._4_4_ * fVar65,
                                  (float)local_a8._0_4_ * (float)local_98);
                break;
              case 6:
                fVar69 = *pfVar57;
                fVar98 = pfVar57[1];
                fVar100 = -fVar98 / fVar69;
                fVar99 = 0.0;
                if ((fVar100 <= fVar65) && (fVar99 = fVar65, fVar65 <= 1.0 / fVar69 + fVar100)) {
                  fVar99 = (fVar69 * fVar65 + fVar98) * fVar65;
                }
                if (fVar100 <= fVar68) {
                  auVar88._0_4_ = fVar99;
                  uVar31 = auVar88._0_8_;
                  if (fVar68 <= fVar100 + 1.0 / fVar69) {
                    uVar31 = CONCAT44((fVar69 * fVar68 + fVar98) * fVar68,fVar99);
                  }
                }
                else {
                  uVar31 = (ulong)(uint)fVar99;
                }
              }
              *puVar51 = (int)uVar31;
              *puVar49 = (int)(uVar31 >> 0x20);
              puVar51 = puVar51 + 1;
              puVar49 = puVar49 + 1;
              local_1e0 = local_1e0 + 1;
              iVar33 = iVar33 + iVar26;
              local_1a0 = local_1a0 + lVar34 * 4;
              local_1c8 = (void *)((long)local_1c8 + lVar34 * 4);
            } while (local_1e0 != uVar47);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_38);
      }
      iVar26 = uVar43 * 4 + (int)local_70 * 2;
      if (iVar26 < iVar10) {
        pvVar36 = top_blob->data;
        iVar10 = top_blob->w;
        sVar12 = top_blob->elemsize;
        local_a8 = (undefined1  [8])(this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        sVar14 = (this->weight_data_tm).cstep;
        local_1a0 = (ulong)iVar26;
        local_98 = lVar40 * 4;
        do {
          pvVar22 = local_f8.data;
          if (0 < (int)uVar9) {
            puVar51 = (undefined4 *)((long)iVar10 * sVar12 * local_1a0 + (long)pvVar36);
            iVar26 = (int)local_1a0;
            iVar33 = iVar26 + 3;
            if (-1 < iVar26) {
              iVar33 = iVar26;
            }
            pfVar30 = (float *)((long)(int)((iVar26 - (((uint)(local_1a0 >> 0x1f) & 1) + iVar26 &
                                                      0xfffffffe)) + (iVar33 >> 2) +
                                           (int)((char)((char)local_1a0 - ((byte)iVar33 & 0xfc)) /
                                                '\x02')) * sVar13 * sVar14 + (long)local_a8);
            lVar27 = (long)local_f8.w *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
            pfVar57 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1d0 = local_98 + (long)local_f8.data;
            local_1b8 = (undefined1 (*) [16])local_f8.data;
            iVar26 = 0;
            local_190 = 0;
            do {
              if (pvVar11 == (void *)0x0) {
                fVar65 = 0.0;
              }
              else {
                fVar65 = *(float *)((long)pvVar11 + local_1a0 * 4);
              }
              pfVar46 = pfVar30;
              if ((int)uVar24 < 4) {
                uVar31 = 0;
                auVar67 = ZEXT816(0);
              }
              else {
                auVar67 = ZEXT816(0);
                iVar33 = 0;
                do {
                  lVar48 = (iVar33 / iVar6) * lVar27;
                  if (iVar6 == 4 && 0 < iVar7) {
                    pfVar32 = (float *)((long)pvVar22 + lVar48 + (long)iVar26 * 4);
                    auVar87 = auVar67;
                    iVar44 = iVar7;
                    do {
                      auVar67._0_4_ = auVar87._0_4_ + *pfVar46 * *pfVar32;
                      auVar67._4_4_ = auVar87._4_4_ + pfVar46[1] * pfVar32[1];
                      auVar67._8_4_ = auVar87._8_4_ + pfVar46[2] * pfVar32[2];
                      auVar67._12_4_ = auVar87._12_4_ + pfVar46[3] * pfVar32[3];
                      pfVar46 = pfVar46 + 4;
                      pfVar32 = pfVar32 + iVar41 * 4;
                      iVar44 = iVar44 + -1;
                      auVar87 = auVar67;
                    } while (iVar44 != 0);
                  }
                  else {
                    pfVar32 = (float *)((long)pvVar22 +
                                       lVar48 + (long)(iVar6 * iVar50 * (int)local_190) * 4);
                  }
                  auVar87 = auVar67;
                  iVar44 = iVar7;
                  if (iVar6 == 1 && 0 < iVar7) {
                    do {
                      auVar67._0_4_ = auVar87._0_4_ + *pfVar32 * *pfVar46;
                      auVar67._4_4_ = auVar87._4_4_ + pfVar32[lVar40] * pfVar46[1];
                      auVar67._8_4_ = auVar87._8_4_ + pfVar32[iVar25 * 2] * pfVar46[2];
                      auVar67._12_4_ = auVar87._12_4_ + pfVar32[iVar25 * 3] * pfVar46[3];
                      pfVar46 = pfVar46 + 4;
                      pfVar32 = pfVar32 + lVar52;
                      iVar44 = iVar44 + -1;
                      auVar87 = auVar67;
                    } while (iVar44 != 0);
                  }
                  iVar44 = iVar33 + 7;
                  iVar33 = iVar33 + 4;
                } while (iVar44 < (int)uVar24);
                uVar31 = (ulong)uVar24 & 0xfffffffc;
              }
              auVar77._4_4_ = auVar67._12_4_ + auVar67._4_4_;
              auVar77._0_4_ = auVar77._4_4_;
              auVar77._8_4_ = auVar77._4_4_;
              auVar77._12_4_ = auVar77._4_4_;
              auVar78._4_12_ = auVar77._4_12_;
              auVar78._0_4_ = auVar77._4_4_ + fVar65 + auVar67._8_4_ + auVar67._0_4_;
              uVar43 = (uint)uVar31;
              if ((int)(uVar43 | 1) < (int)uVar24) {
                lVar48 = local_1d0 + lVar27 * uVar31;
                pvVar37 = (void *)(lVar27 * uVar31 + (long)local_1b8);
                do {
                  auVar81 = auVar78;
                  if (0 < iVar7) {
                    lVar28 = 0;
                    iVar33 = iVar7;
                    do {
                      auVar80._4_4_ =
                           *(float *)(lVar48 + lVar28) *
                           (float)((ulong)*(undefined8 *)pfVar46 >> 0x20);
                      auVar80._0_4_ = auVar80._4_4_;
                      auVar80._8_4_ = auVar80._4_4_;
                      auVar80._12_4_ = auVar80._4_4_;
                      auVar81._4_12_ = auVar80._4_12_;
                      auVar81._0_4_ =
                           auVar80._4_4_ +
                           auVar78._0_4_ +
                           *(float *)((long)pvVar37 + lVar28) * (float)*(undefined8 *)pfVar46;
                      pfVar46 = pfVar46 + 2;
                      lVar28 = lVar28 + lVar52 * 4;
                      auVar78._4_4_ = auVar80._4_4_;
                      auVar78._0_4_ = auVar81._0_4_;
                      auVar78._8_4_ = auVar80._4_4_;
                      auVar78._12_4_ = auVar80._4_4_;
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  auVar78 = auVar81;
                  uVar31 = uVar31 + 2;
                  uVar43 = (uint)uVar31;
                  lVar48 = lVar48 + lVar27 * 2;
                  pvVar37 = (void *)((long)pvVar37 + lVar27 * 2);
                } while ((int)(uVar43 | 1) < (int)uVar24);
              }
              else {
                auVar78._4_4_ = auVar77._4_4_;
                auVar78._8_4_ = auVar77._4_4_;
                auVar78._12_4_ = auVar77._4_4_;
              }
              if ((int)uVar43 < (int)uVar24) {
                uVar31 = (ulong)uVar43;
                pfVar32 = (float *)(lVar27 * uVar31 + (long)local_1b8);
                do {
                  pfVar39 = pfVar32;
                  iVar33 = iVar7;
                  if (0 < iVar7) {
                    do {
                      auVar78._0_4_ = auVar78._0_4_ + *pfVar46 * *pfVar39;
                      pfVar46 = pfVar46 + 1;
                      pfVar39 = pfVar39 + lVar52;
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar27);
                } while ((int)uVar31 < (int)uVar24);
              }
              fVar65 = auVar78._0_4_;
              auVar64 = auVar78;
              switch(iVar8) {
              case 1:
                if (fVar65 <= 0.0) {
                  auVar20._12_4_ = 0;
                  auVar20._0_12_ = auVar78._4_12_;
                  auVar64 = auVar20 << 0x20;
                }
                break;
              case 2:
                auVar64 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar65) & (uint)*pfVar57 |
                                                -(uint)(0.0 < fVar65) & 0x3f800000) * fVar65));
                break;
              case 3:
                if (fVar65 <= *pfVar57) {
                  auVar78._0_4_ = *pfVar57;
                }
                fVar65 = pfVar57[1];
                auVar64 = auVar78;
                if (fVar65 < auVar78._0_4_) {
LAB_0052c668:
                  auVar64 = ZEXT416((uint)fVar65);
                }
                break;
              case 4:
                if (88.37626 <= fVar65) {
                  fVar65 = 88.37626;
                }
                fVar65 = expf((float)(-(uint)(fVar65 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar65 < -88.37626) & (uint)-fVar65));
                auVar64 = ZEXT416((uint)(1.0 / (fVar65 + 1.0)));
                break;
              case 5:
                local_88 = auVar78;
                fVar65 = expf(fVar65);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
                auVar64._0_4_ = fVar65 * (float)local_88._0_4_;
                auVar64._4_12_ = extraout_var;
                break;
              case 6:
                fVar68 = *pfVar57;
                fVar69 = -pfVar57[1] / fVar68;
                auVar64 = ZEXT816(0);
                if ((fVar69 <= fVar65) && (auVar64 = auVar78, fVar65 <= fVar69 + 1.0 / fVar68)) {
                  fVar65 = (fVar68 * fVar65 + pfVar57[1]) * fVar65;
                  goto LAB_0052c668;
                }
              }
              *puVar51 = auVar64._0_4_;
              puVar51 = puVar51 + 1;
              local_190 = local_190 + 1;
              iVar26 = iVar26 + iVar50 * iVar6;
              local_1d0 = local_1d0 + lVar34 * 4;
              local_1b8 = (undefined1 (*) [16])((long)local_1b8 + lVar34 * 4);
            } while (local_190 != uVar9);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != uVar35);
      }
      iVar41 = 0;
    }
  }
  piVar21 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}